

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void QGuiApplicationPrivate::processWindowSystemEvent(WindowSystemEvent *e)

{
  QObject *pQVar1;
  QEvent *this;
  QDebug *this_00;
  long in_FS_OFFSET;
  QDebug local_20;
  long local_18;
  
  pQVar1 = QCoreApplication::self;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(e->type) {
  case GeometryChange:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processGeometryChangeEvent((GeometryChangeEvent *)e);
      return;
    }
    break;
  case 3:
  case 4:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case ScreenAvailableGeometry:
  case 0x13:
  case 0x14:
  case ScreenRefreshRate|FocusWindow:
  case ScreenRefreshRate|WindowStateChanged:
  case 0x17:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case ScreenRefreshRate|ScreenOrientation:
  case ScreenRefreshRate|ScreenGeometry:
  case ScreenRefreshRate|ScreenAvailableGeometry:
  case ScreenRefreshRate|ScreenLogicalDotsPerInch:
switchD_002abc77_caseD_3:
    QMessageLogger::warning();
    this_00 = QDebug::operator<<(&local_20,"Unknown user input event type:");
    QDebug::operator<<(this_00,e->type);
    QDebug::~QDebug(&local_20);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
    break;
  case FocusWindow:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processFocusWindowEvent((FocusWindowEvent *)e);
      return;
    }
    break;
  case WindowStateChanged:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processWindowStateChangedEvent((WindowStateChangedEvent *)e);
      return;
    }
    break;
  case ScreenOrientation:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processScreenOrientationChange((ScreenOrientationEvent *)e);
      return;
    }
    break;
  case ScreenGeometry:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processScreenGeometryChange((ScreenGeometryEvent *)e);
      return;
    }
    break;
  case ScreenLogicalDotsPerInch:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processScreenLogicalDotsPerInchChange((ScreenLogicalDotsPerInchEvent *)e);
      return;
    }
    break;
  case ScreenRefreshRate:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processScreenRefreshRateChange((ScreenRefreshRateEvent *)e);
      return;
    }
    break;
  case ThemeChange:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processThemeChanged((ThemeChangeEvent *)e);
      return;
    }
    break;
  case Expose:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processExposeEvent((ExposeEvent *)e);
      return;
    }
    break;
  case ApplicationStateChanged:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setApplicationState(*(ApplicationState *)&e->field_0x14,*(bool *)&e[1]._vptr_WindowSystemEvent
                         );
      return;
    }
    break;
  case FlushEvents:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QWindowSystemInterface::deferredFlushWindowSystemEvents
                ((QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)
                 *(QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4> *)&e->field_0x14);
      return;
    }
    break;
  case WindowScreenChanged:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processWindowScreenChangedEvent((WindowScreenChangedEvent *)e);
      return;
    }
    break;
  case SafeAreaMarginsChanged:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processSafeAreaMarginsChangedEvent((SafeAreaMarginsChangedEvent *)e);
      return;
    }
    break;
  case ApplicationTermination:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processApplicationTermination(e);
      return;
    }
    break;
  case Paint:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processPaintEvent((PaintEvent *)e);
      return;
    }
    break;
  case WindowDevicePixelRatioChanged:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      processWindowDevicePixelRatioChangedEvent((WindowDevicePixelRatioChangedEvent *)e);
      return;
    }
    break;
  default:
    switch(e->type) {
    case Close:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processCloseEvent((CloseEvent *)e);
        return;
      }
      break;
    default:
      goto switchD_002abc77_caseD_3;
    case Enter:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processEnterEvent((EnterEvent *)e);
        return;
      }
      break;
    case Leave:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processLeaveEvent((LeaveEvent *)e);
        return;
      }
      break;
    case Mouse:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processMouseEvent((MouseEvent *)e);
        return;
      }
      break;
    case Wheel:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processWheelEvent((WheelEvent *)e);
        return;
      }
      break;
    case Key:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processKeyEvent((KeyEvent *)e);
        return;
      }
      break;
    case Touch:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processTouchEvent((TouchEvent *)e);
        return;
      }
      break;
    case FileOpen:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processFileOpenEvent((FileOpenEvent *)e);
        return;
      }
      break;
    case Tablet:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processTabletEvent((TabletEvent *)e);
        return;
      }
      break;
    case TabletEnterProximity:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processTabletEnterProximityEvent((TabletEnterProximityEvent *)e);
        return;
      }
      break;
    case TabletLeaveProximity:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processTabletLeaveProximityEvent((TabletLeaveProximityEvent *)e);
        return;
      }
      break;
    case PlatformPanel:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processPlatformPanelEvent((PlatformPanelEvent *)e);
        return;
      }
      break;
    case ContextMenu:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processContextMenuEvent((ContextMenuEvent *)e);
        return;
      }
      break;
    case EnterWhatsThisMode:
      this = (QEvent *)operator_new(0x10);
      QEvent::QEvent(this,EnterWhatsThisMode);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCoreApplication::postEvent(pQVar1,(QEvent *)this,0);
        return;
      }
      break;
    case Gesture:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        processGestureEvent((GestureEvent *)e);
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

QGuiApplicationPrivate::processWindowSystemEvent(QWindowSystemInterfacePrivate::WindowSystemEvent *e)
{
    Q_TRACE_PARAM_REPLACE(QWindowSystemInterfacePrivate::WindowSystemEvent *, int);
    Q_TRACE_SCOPE(QGuiApplicationPrivate_processWindowSystemEvent, e->type);

    switch(e->type) {
    case QWindowSystemInterfacePrivate::Mouse:
        QGuiApplicationPrivate::processMouseEvent(static_cast<QWindowSystemInterfacePrivate::MouseEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Wheel:
        QGuiApplicationPrivate::processWheelEvent(static_cast<QWindowSystemInterfacePrivate::WheelEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Key:
        QGuiApplicationPrivate::processKeyEvent(static_cast<QWindowSystemInterfacePrivate::KeyEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Touch:
        QGuiApplicationPrivate::processTouchEvent(static_cast<QWindowSystemInterfacePrivate::TouchEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::GeometryChange:
        QGuiApplicationPrivate::processGeometryChangeEvent(static_cast<QWindowSystemInterfacePrivate::GeometryChangeEvent*>(e));
        break;
    case QWindowSystemInterfacePrivate::Enter:
        QGuiApplicationPrivate::processEnterEvent(static_cast<QWindowSystemInterfacePrivate::EnterEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Leave:
        QGuiApplicationPrivate::processLeaveEvent(static_cast<QWindowSystemInterfacePrivate::LeaveEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::FocusWindow:
        QGuiApplicationPrivate::processFocusWindowEvent(static_cast<QWindowSystemInterfacePrivate::FocusWindowEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::WindowStateChanged:
        QGuiApplicationPrivate::processWindowStateChangedEvent(static_cast<QWindowSystemInterfacePrivate::WindowStateChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::WindowScreenChanged:
        QGuiApplicationPrivate::processWindowScreenChangedEvent(static_cast<QWindowSystemInterfacePrivate::WindowScreenChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::WindowDevicePixelRatioChanged:
        QGuiApplicationPrivate::processWindowDevicePixelRatioChangedEvent(static_cast<QWindowSystemInterfacePrivate::WindowDevicePixelRatioChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::SafeAreaMarginsChanged:
        QGuiApplicationPrivate::processSafeAreaMarginsChangedEvent(static_cast<QWindowSystemInterfacePrivate::SafeAreaMarginsChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ApplicationStateChanged: {
        QWindowSystemInterfacePrivate::ApplicationStateChangedEvent * changeEvent = static_cast<QWindowSystemInterfacePrivate::ApplicationStateChangedEvent *>(e);
        QGuiApplicationPrivate::setApplicationState(changeEvent->newState, changeEvent->forcePropagate); }
        break;
    case QWindowSystemInterfacePrivate::ApplicationTermination:
        QGuiApplicationPrivate::processApplicationTermination(e);
        break;
    case QWindowSystemInterfacePrivate::FlushEvents: {
        QWindowSystemInterfacePrivate::FlushEventsEvent *flushEventsEvent = static_cast<QWindowSystemInterfacePrivate::FlushEventsEvent *>(e);
        QWindowSystemInterface::deferredFlushWindowSystemEvents(flushEventsEvent->flags); }
        break;
    case QWindowSystemInterfacePrivate::Close:
        QGuiApplicationPrivate::processCloseEvent(
                static_cast<QWindowSystemInterfacePrivate::CloseEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenOrientation:
        QGuiApplicationPrivate::processScreenOrientationChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenOrientationEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenGeometry:
        QGuiApplicationPrivate::processScreenGeometryChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenGeometryEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInch:
        QGuiApplicationPrivate::processScreenLogicalDotsPerInchChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenRefreshRate:
        QGuiApplicationPrivate::processScreenRefreshRateChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenRefreshRateEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ThemeChange:
        QGuiApplicationPrivate::processThemeChanged(
                    static_cast<QWindowSystemInterfacePrivate::ThemeChangeEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Expose:
        QGuiApplicationPrivate::processExposeEvent(static_cast<QWindowSystemInterfacePrivate::ExposeEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Paint:
        QGuiApplicationPrivate::processPaintEvent(static_cast<QWindowSystemInterfacePrivate::PaintEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Tablet:
        QGuiApplicationPrivate::processTabletEvent(
                    static_cast<QWindowSystemInterfacePrivate::TabletEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::TabletEnterProximity:
        QGuiApplicationPrivate::processTabletEnterProximityEvent(
                    static_cast<QWindowSystemInterfacePrivate::TabletEnterProximityEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::TabletLeaveProximity:
        QGuiApplicationPrivate::processTabletLeaveProximityEvent(
                    static_cast<QWindowSystemInterfacePrivate::TabletLeaveProximityEvent *>(e));
        break;
#ifndef QT_NO_GESTURES
    case QWindowSystemInterfacePrivate::Gesture:
        QGuiApplicationPrivate::processGestureEvent(
                    static_cast<QWindowSystemInterfacePrivate::GestureEvent *>(e));
        break;
#endif
    case QWindowSystemInterfacePrivate::PlatformPanel:
        QGuiApplicationPrivate::processPlatformPanelEvent(
                    static_cast<QWindowSystemInterfacePrivate::PlatformPanelEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::FileOpen:
        QGuiApplicationPrivate::processFileOpenEvent(
                    static_cast<QWindowSystemInterfacePrivate::FileOpenEvent *>(e));
        break;
#ifndef QT_NO_CONTEXTMENU
        case QWindowSystemInterfacePrivate::ContextMenu:
        QGuiApplicationPrivate::processContextMenuEvent(
                    static_cast<QWindowSystemInterfacePrivate::ContextMenuEvent *>(e));
        break;
#endif
    case QWindowSystemInterfacePrivate::EnterWhatsThisMode:
        QGuiApplication::postEvent(QGuiApplication::instance(), new QEvent(QEvent::EnterWhatsThisMode));
        break;
    default:
        qWarning() << "Unknown user input event type:" << e->type;
        break;
    }
}